

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O3

float MatrixDeterminant(Matrix mat)

{
  return mat.m0 * mat.m5 * mat.m10 * mat.m15 +
         (((mat.m8 * mat.m1 * mat.m6 * mat.m15 +
           mat.m4 * mat.m9 * mat.m2 * mat.m15 +
           (((mat.m1 * mat.m4 * mat.m14 * mat.m11 +
             mat.m13 * mat.m0 * mat.m6 * mat.m11 +
             (((mat.m5 * mat.m12 * mat.m2 * mat.m11 +
               mat.m9 * mat.m0 * mat.m14 * mat.m7 +
               (((mat.m10 * mat.m12 * mat.m1 * mat.m7 +
                 mat.m8 * mat.m13 * mat.m2 * mat.m7 +
                 (((mat.m5 * mat.m8 * mat.m14 * mat.m3 +
                   mat.m10 * mat.m4 * mat.m13 * mat.m3 +
                   ((mat.m6 * mat.m9 * mat.m12 * mat.m3 - mat.m6 * mat.m8 * mat.m13 * mat.m3) -
                   mat.m10 * mat.m5 * mat.m12 * mat.m3)) - mat.m14 * mat.m4 * mat.m9 * mat.m3) -
                 mat.m9 * mat.m12 * mat.m2 * mat.m7)) - mat.m10 * mat.m13 * mat.m0 * mat.m7) -
               mat.m14 * mat.m8 * mat.m1 * mat.m7)) - mat.m4 * mat.m13 * mat.m2 * mat.m11) -
             mat.m12 * mat.m1 * mat.m6 * mat.m11)) - mat.m14 * mat.m0 * mat.m5 * mat.m11) -
           mat.m5 * mat.m8 * mat.m2 * mat.m15)) - mat.m9 * mat.m0 * mat.m6 * mat.m15) -
         mat.m1 * mat.m4 * mat.m10 * mat.m15);
}

Assistant:

RMDEF float MatrixDeterminant(Matrix mat)
{
    // Cache the matrix values (speed optimization)
    float a00 = mat.m0, a01 = mat.m1, a02 = mat.m2, a03 = mat.m3;
    float a10 = mat.m4, a11 = mat.m5, a12 = mat.m6, a13 = mat.m7;
    float a20 = mat.m8, a21 = mat.m9, a22 = mat.m10, a23 = mat.m11;
    float a30 = mat.m12, a31 = mat.m13, a32 = mat.m14, a33 = mat.m15;

    float result = a30*a21*a12*a03 - a20*a31*a12*a03 - a30*a11*a22*a03 + a10*a31*a22*a03 +
                   a20*a11*a32*a03 - a10*a21*a32*a03 - a30*a21*a02*a13 + a20*a31*a02*a13 +
                   a30*a01*a22*a13 - a00*a31*a22*a13 - a20*a01*a32*a13 + a00*a21*a32*a13 +
                   a30*a11*a02*a23 - a10*a31*a02*a23 - a30*a01*a12*a23 + a00*a31*a12*a23 +
                   a10*a01*a32*a23 - a00*a11*a32*a23 - a20*a11*a02*a33 + a10*a21*a02*a33 +
                   a20*a01*a12*a33 - a00*a21*a12*a33 - a10*a01*a22*a33 + a00*a11*a22*a33;

    return result;
}